

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtest.cpp
# Opt level: O0

void __thiscall
hashTestKey::hashTestKey(hashTestKey *this,uint8_t *text,size_t text_len,size_t indx)

{
  size_t indx_local;
  size_t text_len_local;
  uint8_t *text_local;
  hashTestKey *this_local;
  
  this->count = 1;
  this->hash = 0;
  this->indx = indx;
  this->HashNext = (hashTestKey *)0x0;
  this->LessRecentKey = (hashTestKey *)0x0;
  this->MoreRecentKey = (hashTestKey *)0x0;
  indx_local = text_len;
  if (0x10 < text_len) {
    indx_local = 0x10;
  }
  memcpy(this->text,text,indx_local);
  this->text_len = (uint32_t)indx_local;
  return;
}

Assistant:

hashTestKey(uint8_t const * text, size_t text_len, size_t indx)
        :
        count(1),
        hash(0),
        indx(indx),
        HashNext(NULL),
        LessRecentKey(NULL),
        MoreRecentKey(NULL)
    {
        if (text_len > 16)
        {
            text_len = 16;
        }

        memcpy(this->text, text, text_len);
        this->text_len = (uint32_t) text_len;
    }